

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Gia_Man_t * Acb_NtkEcoSynthesize(Gia_Man_t *p)

{
  bool bVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  bool bVar4;
  
  pGVar2 = Gia_ManDup(p);
  pGVar3 = Gia_ManAreaBalance(pGVar2,0,0,0,0);
  Gia_ManStop(pGVar2);
  bVar1 = true;
  do {
    bVar4 = bVar1;
    pGVar2 = Gia_ManCompress2(pGVar3,1,0);
    Gia_ManStop(pGVar3);
    pGVar3 = pGVar2;
    bVar1 = false;
  } while (bVar4);
  pGVar3 = Gia_ManAigSyn2(pGVar2,0,1,0,100,0,0,0);
  Gia_ManStop(pGVar2);
  bVar1 = true;
  do {
    bVar4 = bVar1;
    pGVar2 = Gia_ManCompress2(pGVar3,1,0);
    Gia_ManStop(pGVar3);
    pGVar3 = pGVar2;
    bVar1 = false;
  } while (bVar4);
  return pGVar2;
}

Assistant:

Gia_Man_t * Acb_NtkEcoSynthesize( Gia_Man_t * p )
{
    int Iter, fVerbose = 0;
    Gia_Man_t * pNew = Gia_ManDup( p );

    if ( fVerbose ) printf( "M_quo: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    pNew = Gia_ManAreaBalance( p = pNew, 0, 0, 0, 0 );
    Gia_ManStop( p );

    if ( fVerbose ) printf( "M_bal: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    for ( Iter = 0; Iter < 2; Iter++ )
    {
        pNew = Gia_ManCompress2( p = pNew, 1, 0 );
        Gia_ManStop( p );

        if ( fVerbose ) printf( "M_dc2: " );
        if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );
    }

    pNew = Gia_ManAigSyn2( p = pNew, 0, 1, 0, 100, 0, 0, 0 );
    Gia_ManStop( p );

    if ( fVerbose ) printf( "M_sn2: " );
    if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );

    for ( Iter = 0; Iter < 2; Iter++ )
    {
        pNew = Gia_ManCompress2( p = pNew, 1, 0 );
        Gia_ManStop( p );

        if ( fVerbose ) printf( "M_dc2: " );
        if ( fVerbose ) Gia_ManPrintStats( pNew, NULL );
    }
    return pNew;
}